

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

Var __thiscall
Js::RegSlotVariablesWalker::GetVarObjectAndRegAt
          (RegSlotVariablesWalker *this,int index,RegSlot *reg)

{
  DebuggerPropertyDisplayInfo *this_00;
  DiagStackFrame *pDVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Type *ppDVar6;
  undefined4 extraout_var;
  DebuggerPropertyDisplayInfo *displayInfo;
  Var pvStack_28;
  RegSlot returnedReg;
  Var returnedVar;
  RegSlot *reg_local;
  int index_local;
  RegSlotVariablesWalker *this_local;
  
  iVar4 = JsUtil::
          ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>::
          Count(&((this->super_VariableWalkerBase).pMembersList)->
                 super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
               );
  if (iVar4 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x306,"(index < pMembersList->Count())",
                                "index < pMembersList->Count()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  displayInfo._4_4_ = 0xffffffff;
  ppDVar6 = JsUtil::
            List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item((this->super_VariableWalkerBase).pMembersList,index);
  this_00 = *ppDVar6;
  bVar3 = DebuggerPropertyDisplayInfo::IsInDeadZone(this_00);
  if (bVar3) {
    bVar3 = VarIs<Js::JavascriptString>(this_00->aVar);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x30f,"(VarIs<JavascriptString>(displayInfo->aVar))",
                                  "VarIs<JavascriptString>(displayInfo->aVar)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pvStack_28 = this_00->aVar;
  }
  else {
    displayInfo._4_4_ = ::Math::PointerCastToIntegral<unsigned_int>(this_00->aVar);
    pDVar1 = (this->super_VariableWalkerBase).pFrame;
    iVar4 = (*pDVar1->_vptr_DiagStackFrame[5])(pDVar1,(ulong)displayInfo._4_4_,0);
    pvStack_28 = (Var)CONCAT44(extraout_var,iVar4);
  }
  if (reg != (RegSlot *)0x0) {
    *reg = displayInfo._4_4_;
  }
  if (pvStack_28 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x31d,"(returnedVar)",
                                "Var should be replaced with the dead zone string object.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return pvStack_28;
}

Assistant:

Var RegSlotVariablesWalker::GetVarObjectAndRegAt(int index, RegSlot* reg /*= nullptr*/)
    {
        Assert(index < pMembersList->Count());

        Var returnedVar = nullptr;
        RegSlot returnedReg = Js::Constants::NoRegister;

        DebuggerPropertyDisplayInfo* displayInfo = pMembersList->Item(index);
        if (displayInfo->IsInDeadZone())
        {
            // The uninitialized string is already set in the var for the dead zone display.
            Assert(VarIs<JavascriptString>(displayInfo->aVar));
            returnedVar = displayInfo->aVar;
        }
        else
        {
            returnedReg = ::Math::PointerCastToIntegral<RegSlot>(displayInfo->aVar);
            returnedVar = pFrame->GetRegValue(returnedReg);
        }

        if (reg != nullptr)
        {
            *reg = returnedReg;
        }

        AssertMsg(returnedVar, "Var should be replaced with the dead zone string object.");
        return returnedVar;
    }